

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_8UL>_>
::map(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_8UL>_>
      *this,uint32_t capa_bits,uint64_t lambda)

{
  int iVar1;
  bool bVar2;
  value_type_conflict3 vVar3;
  undefined8 uVar4;
  reference pvVar5;
  uint64_t in_RDX;
  undefined1 *in_RDI;
  array<unsigned_char,_256UL> *this_00;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_fffffffffffffee0;
  compact_bonsai_nlm<int,_8UL> *this_01;
  value_type_conflict3 *__u;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  compact_bonsai_nlm<int,_8UL> local_d8;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffff70;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0x20;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::plain_bonsai_trie(in_stack_fffffffffffffee0);
  compact_bonsai_nlm<int,_8UL>::compact_bonsai_nlm
            ((compact_bonsai_nlm<int,_8UL> *)in_stack_fffffffffffffee0);
  memset(in_RDI + 0xb0,0,0x100);
  *(undefined4 *)(in_RDI + 0x1b0) = 0;
  *(undefined8 *)(in_RDI + 0x1b8) = 0;
  bVar2 = is_power2(in_RDX);
  if (!bVar2) {
    uVar4 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffee0,
               (char *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    __cxa_throw(uVar4,&exception::typeinfo,exception::~exception);
  }
  *in_RDI = 1;
  *(uint64_t *)(in_RDI + 8) = in_RDX;
  bit_tools::ceil_log2((uint64_t)in_stack_fffffffffffffee0);
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::plain_bonsai_trie
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  this_00 = (array<unsigned_char,_256UL> *)(in_RDI + 0x10);
  __u = &stack0xffffffffffffff68;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::operator=
            (in_stack_fffffffffffffee0,
             (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::~plain_bonsai_trie
            ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)0x202994);
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::capa_bits
            ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)0x20299e);
  compact_bonsai_nlm<int,_8UL>::compact_bonsai_nlm
            ((compact_bonsai_nlm<int,_8UL> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (uint32_t)((ulong)in_RDI >> 0x20));
  this_01 = &local_d8;
  compact_bonsai_nlm<int,_8UL>::operator=
            (this_01,(compact_bonsai_nlm<int,_8UL> *)
                     CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  compact_bonsai_nlm<int,_8UL>::~compact_bonsai_nlm(this_01);
  std::array<unsigned_char,_256UL>::fill(this_00,__u);
  iVar1 = *(int *)(in_RDI + 0x1b0);
  *(int *)(in_RDI + 0x1b0) = iVar1 + 1;
  vVar3 = (value_type_conflict3)iVar1;
  pvVar5 = std::array<unsigned_char,_256UL>::operator[]
                     ((array<unsigned_char,_256UL> *)this_01,
                      CONCAT17(vVar3,in_stack_fffffffffffffed8));
  *pvVar5 = vVar3;
  return;
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }